

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O2

void lua_gettable(lua_State *L,int idx)

{
  TValue *t;
  
  t = index2addr(L,idx);
  luaV_gettable(L,t,L->top + -1,L->top + -1);
  return;
}

Assistant:

LUA_API void lua_gettable (lua_State *L, int idx) {
  StkId t;
  lua_lock(L);
  t = index2addr(L, idx);
  api_checkvalidindex(L, t);
  luaV_gettable(L, t, L->top - 1, L->top - 1);
  lua_unlock(L);
}